

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ExceptionFilterOptions>::construct
          (BasicTypeInfo<dap::ExceptionFilterOptions> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ExceptionFilterOptions> *this_local;
  
  memset(ptr,0,0x48);
  ExceptionFilterOptions::ExceptionFilterOptions((ExceptionFilterOptions *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }